

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

vector<YAML::Node,_std::allocator<YAML::Node>_> * YAML::LoadAll(istream *input)

{
  undefined1 uVar1;
  NodeBuilder *in_RDI;
  NodeBuilder builder;
  Parser parser;
  vector<YAML::Node,_std::allocator<YAML::Node>_> *docs;
  undefined7 in_stack_fffffffffffffef8;
  NodeBuilder *in;
  Parser *in_stack_ffffffffffffff10;
  NodeBuilder *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar2;
  EventHandler *in_stack_ffffffffffffff70;
  Parser *in_stack_ffffffffffffff78;
  
  in = in_RDI;
  std::vector<YAML::Node,_std::allocator<YAML::Node>_>::vector
            ((vector<YAML::Node,_std::allocator<YAML::Node>_> *)0xf11ec1);
  Parser::Parser(in_stack_ffffffffffffff10,(istream *)in);
  while( true ) {
    NodeBuilder::NodeBuilder
              ((NodeBuilder *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    uVar1 = Parser::HandleNextDocument(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if ((bool)uVar1) {
      NodeBuilder::Root(in_stack_ffffffffffffff38);
      std::vector<YAML::Node,_std::allocator<YAML::Node>_>::push_back
                ((vector<YAML::Node,_std::allocator<YAML::Node>_> *)in_RDI,
                 (value_type *)CONCAT17(uVar1,in_stack_fffffffffffffef8));
      Node::~Node((Node *)in_RDI);
      iVar2 = 0;
    }
    else {
      iVar2 = 3;
    }
    NodeBuilder::~NodeBuilder(in_RDI);
    if (iVar2 != 0) break;
    in_stack_ffffffffffffff54 = 0;
  }
  Parser::~Parser((Parser *)in_RDI);
  return (vector<YAML::Node,_std::allocator<YAML::Node>_> *)in;
}

Assistant:

std::vector<Node> LoadAll(std::istream& input) {
  std::vector<Node> docs;

  Parser parser(input);
  while (true) {
    NodeBuilder builder;
    if (!parser.HandleNextDocument(builder)) {
      break;
    }
    docs.push_back(builder.Root());
  }

  return docs;
}